

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O2

size_t __thiscall
curlpp::internal::CurlHandle::executeHeaderFunctor
          (CurlHandle *this,char *buffer,size_t size,size_t nitems)

{
  FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  CallbackException<curlpp::LogicError> *this_00;
  LogicError LStack_28;
  size_t sVar3;
  
  pFVar1 = (this->mHeaderFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                 *)0x0) {
    this_00 = (CallbackException<curlpp::LogicError> *)operator_new(0x20);
    LogicError::LogicError(&LStack_28,"Null write functor");
    CallbackException<curlpp::LogicError>::CallbackException(this_00,&LStack_28);
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = (CallbackExceptionBase *)this_00;
    LogicError::~LogicError(&LStack_28);
    sVar3 = 0x2a;
  }
  else {
    iVar2 = (**pFVar1->_vptr_FunctorImpl)();
    sVar3 = CONCAT44(extraout_var,iVar2);
  }
  return sVar3;
}

Assistant:

size_t 
CurlHandle::executeHeaderFunctor(char * buffer, size_t size, size_t nitems)
{
	if (!mHeaderFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mHeaderFunctor(buffer, size, nitems);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}